

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<unsigned_long>::assign
          (SmallVectorImpl<unsigned_long> *this,size_type NumElts,unsigned_long *Elt)

{
  uint uVar1;
  void *pvVar2;
  unsigned_long uVar3;
  long lVar4;
  
  (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  if ((this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity < NumElts)
  {
    SmallVectorTemplateBase<unsigned_long,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_long,_true>,NumElts);
  }
  SmallVectorBase::set_size((SmallVectorBase *)this,NumElts);
  pvVar2 = (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
           super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
  uVar1 = (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
          super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size;
  uVar3 = *Elt;
  for (lVar4 = 0; (ulong)uVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(unsigned_long *)((long)pvVar2 + lVar4) = uVar3;
  }
  return;
}

Assistant:

void assign(size_type NumElts, const T &Elt) {
    clear();
    if (this->capacity() < NumElts)
      this->grow(NumElts);
    this->set_size(NumElts);
    std::uninitialized_fill(this->begin(), this->end(), Elt);
  }